

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

ostream * operator<<(ostream *stream,Path *p)

{
  pointer pcVar1;
  ostream *poVar2;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  pcVar1 = (p->m_path)._M_dataplus._M_p;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (p->m_path)._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(stream,local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const Path& p)
{
  return stream << p.str();
}